

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBool
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,bool value)

{
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar1;
  ExprBase EVar2;
  Impl *local_18;
  
  pBVar1 = this->builder_;
  local_18 = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&(pBVar1->super_ExprFactory).exprs_,&local_18);
  EVar2.impl_ = (Impl *)operator_new__(0x40);
  (EVar2.impl_)->kind_ = BOOL;
  ((ExprBase *)
  ((pBVar1->super_ExprFactory).exprs_.
   super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
   ._M_impl.super__Vector_impl_data._M_finish + -1))->impl_ = EVar2.impl_;
  *(bool *)&EVar2.impl_[1].kind_ = value;
  return (LogicalExpr)EVar2.impl_;
}

Assistant:

LogicalExpr OnBool(bool value) {
    return builder_.MakeLogicalConstant(value);
  }